

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::BasicComputeTestInstance::~BasicComputeTestInstance
          (BasicComputeTestInstance *this)

{
  BasicComputeTestInstance *this_local;
  
  ~BasicComputeTestInstance(this);
  operator_delete(this,0x1d8);
  return;
}

Assistant:

BasicComputeTestInstance::~BasicComputeTestInstance(void)
{
}